

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  option_t *poVar7;
  size_t sVar8;
  char *pcVar9;
  sourcefile_t *psVar10;
  char *pcVar11;
  char *pcVar12;
  FILE *pFVar13;
  FILE *pFVar14;
  char *pcVar15;
  char **ppcVar16;
  
  esetprogram("gbcc");
  esetonfatal(on_fatal_error);
  parse_options(argc,argv,0,help,version);
  iVar3 = errors();
  if (iVar3 == 0) {
    poVar7 = get_option("-E");
    iVar3 = poVar7->set;
    poVar7 = get_option("-S");
    iVar1 = poVar7->set;
    poVar7 = get_option("-c");
    iVar2 = poVar7->set;
    poVar7 = get_option("-o");
    sVar8 = strlen((poVar7->value).str);
    pcVar9 = (char *)mmalloc(sVar8 + 1);
    poVar7 = get_option("-o");
    strcpy(pcVar9,(poVar7->value).str);
    file_first();
    while (psVar10 = file_next(), psVar10 != (sourcefile_t *)0x0) {
      if (psVar10->type == C) {
        pcVar11 = m_tmpnam();
        iVar5 = psVar10->tmp;
        sVar8 = strlen(psVar10->name);
        pcVar12 = (char *)mmalloc(sVar8 + 1);
        strcpy(pcVar12,psVar10->name);
        esetfile(psVar10->name);
        pFVar13 = fopen(pcVar12,"rb");
        if (pFVar13 == (FILE *)0x0) {
          ccerr(F,"unable to open \"%s\"",psVar10->name);
        }
        else {
          pFVar14 = fopen(pcVar11,"wb");
          if (pFVar14 == (FILE *)0x0) {
            fclose(pFVar13);
            ccerr(F,"unable to create output file");
          }
          else {
            iVar4 = pp(pcVar12,(FILE *)pFVar13,(FILE *)pFVar14);
            if (iVar4 == 0) {
              fclose(pFVar14);
            }
            else {
              file_set_attr(I,(uint)(iVar3 == 0));
              fclose(pFVar14);
              pcVar15 = pcVar9;
              if (pcVar9 == (char *)0x0 || iVar3 == 0) {
                pcVar15 = file_name();
              }
              iVar4 = copy_file(pcVar11,pcVar15);
              if (iVar4 == 0) {
                err(F,"could not write to the output file");
              }
            }
            fclose(pFVar13);
            remove(pcVar11);
            if (iVar5 != 0) {
              remove(pcVar12);
            }
          }
        }
      }
    }
    file_first();
    while ((psVar10 = file_next(), psVar10 != (sourcefile_t *)0x0 && (iVar3 == 0))) {
      if (psVar10->type == I) {
        pcVar11 = m_tmpnam();
        iVar5 = psVar10->tmp;
        sVar8 = strlen(psVar10->name);
        pcVar12 = (char *)mmalloc(sVar8 + 1);
        strcpy(pcVar12,psVar10->name);
        esetfile(psVar10->name);
        pFVar13 = fopen(pcVar12,"rb");
        if (pFVar13 == (FILE *)0x0) {
          ccerr(E,"unable to open \"%s\"",psVar10->name);
        }
        else {
          pFVar14 = fopen(pcVar11,"wb");
          if (pFVar14 == (FILE *)0x0) {
            fclose(pFVar13);
            ccerr(E,"unable to create output file");
          }
          else {
            iVar4 = parse((FILE *)pFVar13,(FILE *)pFVar14);
            if (iVar4 == 0) {
              fclose(pFVar14);
            }
            else {
              file_set_attr(S,(uint)(iVar1 == 0));
              fclose(pFVar14);
              pcVar15 = pcVar9;
              if (iVar1 == 0 || pcVar9 == (char *)0x0) {
                pcVar15 = file_name();
              }
              iVar4 = copy_file(pcVar11,pcVar15);
              if (iVar4 == 0) {
                err(F,"could not write to the output file");
              }
            }
            fclose(pFVar13);
            remove(pcVar11);
            if (iVar5 != 0) {
              remove(pcVar12);
            }
          }
        }
      }
    }
    file_first();
    while ((psVar10 = file_next(), psVar10 != (sourcefile_t *)0x0 && (iVar1 == 0))) {
      if (psVar10->type == S) {
        iVar3 = psVar10->tmp;
        poVar7 = get_option("-o");
        iVar5 = poVar7->set;
        sVar8 = strlen(psVar10->name);
        pcVar9 = (char *)mmalloc(sVar8 + 1);
        strcpy(pcVar9,psVar10->name);
        if ((iVar2 == 0) && (iVar4 = file_count(), 1 < iVar4)) {
          poVar7 = get_option("-o");
          poVar7->set = 0;
        }
        ppcVar16 = gen_options(1);
        if (iVar2 == 0) {
          ppcVar16 = add_option(ppcVar16,"-c");
        }
        poVar7 = get_option("-o");
        poVar7->set = iVar5;
        ppcVar16 = add_option(ppcVar16,pcVar9);
        iVar5 = exec("gbas",ppcVar16);
        if ((iVar5 != 0) && (file_set_attr(O,0), iVar3 != 0)) {
          remove(pcVar9);
        }
      }
    }
    file_first();
    if ((iVar2 == 0) && (iVar3 = errors(), iVar3 == 0)) {
      ppcVar16 = gen_options(1);
      while (psVar10 = file_next(), psVar10 != (sourcefile_t *)0x0) {
        ppcVar16 = add_option(ppcVar16,psVar10->name);
      }
      exec("gbld",ppcVar16);
    }
    iVar3 = errors();
    uVar6 = (uint)(iVar3 != 0);
  }
  else {
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

int main(int argc, char** argv)
{
    sourcefile_t* file = NULL;
    char* output_name = NULL;

    int donot_compile = 0;
    int donot_assemble = 0;
    int donot_link = 0;

    esetprogram(pgm);
    esetonfatal(&on_fatal_error);

    parse_options(argc, argv, GBCC, &help, &version);

    if (errors())
        return EXIT_FAILURE;

    donot_compile = get_option("-E")->set;
    donot_assemble = get_option("-S")->set;
    donot_link = get_option("-c")->set;

    output_name = (char*)mmalloc(strlen(get_option("-o")->value.str) + 1);
    strcpy(output_name, get_option("-o")->value.str);

    /* .c source files */
    file_first();
    while ((file = file_next()) != NULL)
    {
        if (file->type == C)
        {
            FILE* infile = NULL;
            FILE* outfile = NULL;
            char* iname = NULL;
            char* oname = m_tmpnam();
            int   del = file->tmp;

            iname = (char*)mmalloc(strlen(file->name) + 1);
            strcpy(iname, file->name);

            esetfile(file->name);

            /*printf("*** preprocessor in: %s\n", iname);
              printf("*** tmp out: %s\n", oname); */

            if (! (infile = fopen(iname, "rb")) )
            {
                ccerr(F, "unable to open \"%s\"", file->name);
                continue;
            }

            if (! (outfile = fopen(oname, "wb")) )
            {
                fclose(infile);
                ccerr(F, "unable to create output file");
                continue;
            }

            if (pp(iname, infile, outfile))
            {
                /* Update file attributes in the list to get the output
                file name. In case of error the type is not changed and will
                be ignored by further compilation steps. */
                file_set_attr(I, !donot_compile);

                /* Copy the tmp file content to the output file */
                fclose(outfile);
                if (donot_compile && output_name)
                {
                    if (!copy_file(oname, output_name))
                        err(F, "could not write to the output file");
                    /* printf("*** preprocessor out: %s\n\n", file_name()); */
                }
                else
                {
                    if (!copy_file(oname, file_name()))
                        err(F, "could not write to the output file");
                }
            }
            else
                fclose(outfile);

            fclose(infile);
            remove(oname);
            if (del)
                remove(iname);

        }
    }
/*
    file_top();
    printf("\nRemaining files: \n");
    while((file = file_next()) != NULL)
        printf("* %s %s\n", file->name, file->tmp ? "to be removed" : "end product");
    putchar('\n');
*/

    file_first();
    while ((file = file_next()) != NULL && !donot_compile)
    {
        if (file->type == I)
        {
            FILE* infile = NULL;
            FILE* outfile = NULL;
            char* iname = NULL;
            char* oname = m_tmpnam();
            int   del = file->tmp;

            iname = (char*)mmalloc(strlen(file->name) + 1);
            strcpy(iname, file->name);

            esetfile(file->name);

            /* printf("*** parser in: %s\n", iname);
               printf("*** tmp out: %s\n", oname); */

            if (! (infile = fopen(iname, "rb")) )
            {
                ccerr(E, "unable to open \"%s\"", file->name);
                continue;
            }

            if (! (outfile = fopen(oname, "wb")) )
            {
                fclose(infile);
                ccerr(E, "unable to create output file");
                continue;
            }

            if (parse(infile, outfile))
            {
                file_set_attr(S, !donot_assemble);
                fclose(outfile);
                if (donot_assemble && output_name)
                {
                    if (!copy_file(oname, output_name))
                        err(F, "could not write to the output file");
                }
                else
                {
                    if (!copy_file(oname, file_name()))
                        err(F, "could not write to the output file");
                }
            }
            else
                fclose(outfile);

            fclose(infile);
            remove(oname);
            if (del)
                remove(iname);

        }
    }
/*
    file_top();
    printf("\nRemaining files: \n");
    while((file = file_next()) != NULL)
        printf("* %s %s\n", file->name, file->tmp ? "to be removed" : "end product");
*/

    file_first();
    while ((file = file_next()) != NULL && !donot_assemble)
    {
        if (file->type == S)
        {
            char*  iname = NULL;
            int    del = file->tmp;
            char** opts;
            int oset = get_option("-o")->set;

            iname = (char*)mmalloc(strlen(file->name) + 1);
            strcpy(iname, file->name);

            if (!donot_link && file_count() > 1)
                get_option("-o")->set = 0;

            opts = gen_options(GBAS);
            /* We don't want gbas to invoke the linker */
            if (!donot_link)
                opts = add_option(opts, "-c");
            get_option("-o")->set = oset;

            opts = add_option(opts, iname);
            if (exec("gbas", opts))
            {
                file_set_attr(O, 0);
                if (del)
                    remove(iname);
            }
        }
    }

    file_first();
    if (!donot_link && !errors())
    {
        char** opts;
        opts = gen_options(GBAS);
        while ((file = file_next()))
            opts = add_option(opts, file->name);
        exec("gbld", opts);
    }

    if (errors())
        return EXIT_FAILURE;

    return EXIT_SUCCESS;
}